

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

Mat __thiscall Mat::Cross(Mat *this,Mat *rhs)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ostream *poVar4;
  int *in_RDX;
  Mat MVar5;
  
  if ((rhs->n_cols_ * rhs->n_rows_ == 3) && (in_RDX[1] * *in_RDX == 3)) {
    this->n_rows_ = 3;
    this->n_cols_ = 1;
    pdVar3 = (double *)operator_new__(0x18);
    this->v_ = pdVar3;
    *pdVar3 = 0.0;
    pdVar3[1] = 0.0;
    pdVar3[2] = 0.0;
    pdVar1 = rhs->v_;
    pdVar2 = *(double **)(in_RDX + 2);
    *pdVar3 = pdVar1[1] * pdVar2[2] - pdVar2[1] * pdVar1[2];
    pdVar3[1] = pdVar1[2] * *pdVar2 - pdVar2[2] * *pdVar1;
    pdVar3[2] = *pdVar1 * pdVar2[1] - *pdVar2 * pdVar1[1];
    MVar5.v_ = pdVar2;
    MVar5._0_8_ = this;
    return MVar5;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"ERROR: Invalid dimension in Cross(Vector,Vector)")
  ;
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(1);
}

Assistant:

inline int Mat::Size() const
{
	return n_rows_*n_cols_;
}